

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadHandler.cxx
# Opt level: O2

int __thiscall cmCTestUploadHandler::ProcessHandler(cmCTestUploadHandler *this)

{
  _Rb_tree_node_base *value;
  cmCTest *pcVar1;
  bool bVar2;
  char *__rhs;
  ostream *poVar3;
  _Base_ptr p_Var4;
  int iVar5;
  _Self __tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  cmCTestUploadHandler *local_4b0;
  cmXMLWriter xml;
  string local_450;
  string buildname;
  string local_410;
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream ofs;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  cmCTest::GetCurrentTag_abi_cxx11_((string *)&cmCTestLog_msg,pcVar1);
  std::__cxx11::string::string((string *)&xml,"Upload.xml",(allocator *)&buildname);
  bVar2 = cmCTest::OpenOutputFile(pcVar1,(string *)&cmCTestLog_msg,(string *)&xml,&ofs,false);
  std::__cxx11::string::~string((string *)&xml);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string((string *)&xml,"BuildName",(allocator *)&local_4d0);
    cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar1,(string *)&xml);
    cmCTest::SafeBuildIdField(&buildname,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&xml);
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&ofs,0);
    cmXMLWriter::StartDocument(&xml,"UTF-8");
    cmXMLWriter::ProcessingInstruction
              (&xml,"xml-stylesheet",
               "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
              );
    std::__cxx11::string::string((string *)&cmCTestLog_msg,"Site",(allocator *)&local_4d0);
    cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"BuildName",&buildname);
    cmCTest::GetCurrentTag_abi_cxx11_(&local_450,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_4d0,&local_450,"-");
    cmCTest::GetTestModelString_abi_cxx11_(&local_410,(this->super_cmCTestGenericHandler).CTest);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,&local_4d0,&local_410);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"BuildStamp",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmCTestLog_msg)
    ;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_450);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string((string *)&local_4d0,"Site",(allocator *)&local_450);
    cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar1,&local_4d0);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"Name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmCTestLog_msg)
    ;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::string((string *)&local_4d0,"ctest",(allocator *)&local_450);
    __rhs = cmVersion::GetCMakeVersion();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,&local_4d0,__rhs);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"Generator",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmCTestLog_msg)
    ;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&local_4d0);
    cmCTest::AddSiteProperties((this->super_cmCTestGenericHandler).CTest,&xml);
    std::__cxx11::string::string((string *)&cmCTestLog_msg,"Upload",(allocator *)&local_4d0);
    cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    local_4b0 = this;
    for (p_Var4 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->Files)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"\tUpload file: ");
      value = p_Var4 + 1;
      poVar3 = std::operator<<(poVar3,(string *)value);
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                   ,0x3c,local_4d0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::__cxx11::string::string((string *)&cmCTestLog_msg,"File",(allocator *)&local_4d0);
      cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xml,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
      std::__cxx11::string::string((string *)&cmCTestLog_msg,"Content",(allocator *)&local_4d0);
      cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      cmXMLWriter::Attribute<char[7]>(&xml,"encoding",(char (*) [7])"base64");
      cmCTest::Base64EncodeFile
                ((string *)&cmCTestLog_msg,(local_4b0->super_cmCTestGenericHandler).CTest,
                 (string *)value);
      cmXMLWriter::Content<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      cmXMLWriter::EndElement(&xml);
      cmXMLWriter::EndElement(&xml);
    }
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndDocument(&xml);
    cmXMLWriter::~cmXMLWriter(&xml);
    std::__cxx11::string::~string((string *)&buildname);
    iVar5 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot open Upload.xml file");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                 ,0x23,(char *)xml.Output,false);
    std::__cxx11::string::~string((string *)&xml);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar5 = -1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  return iVar5;
}

Assistant:

int cmCTestUploadHandler::ProcessHandler()
{
  cmGeneratedFileStream ofs;
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), "Upload.xml",
                                   ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open Upload.xml file"
                 << std::endl);
    return -1;
  }
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));
  cmCTest::SetOfStrings::const_iterator it;

  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp", this->CTest->GetCurrentTag() + "-" +
                  this->CTest->GetTestModelString());
  xml.Attribute("Name", this->CTest->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest") + cmVersion::GetCMakeVersion());
  this->CTest->AddSiteProperties(xml);
  xml.StartElement("Upload");

  for (it = this->Files.begin(); it != this->Files.end(); it++) {
    cmCTestOptionalLog(this->CTest, OUTPUT,
                       "\tUpload file: " << *it << std::endl, this->Quiet);
    xml.StartElement("File");
    xml.Attribute("filename", *it);
    xml.StartElement("Content");
    xml.Attribute("encoding", "base64");
    xml.Content(this->CTest->Base64EncodeFile(*it));
    xml.EndElement(); // Content
    xml.EndElement(); // File
  }
  xml.EndElement(); // Upload
  xml.EndElement(); // Site
  xml.EndDocument();
  return 0;
}